

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

Move __thiscall banksia::ChessBoard::fromSanString(ChessBoard *this,string *str)

{
  string sVar1;
  byte bVar2;
  size_type sVar3;
  pointer pPVar4;
  PieceType promotion;
  Move *pMVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  undefined *puVar9;
  iterator iVar10;
  ChessBoard *this_00;
  int iVar11;
  uint dest;
  PieceType PVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  ChessBoard *this_01;
  string *unaff_R12;
  size_type sVar17;
  string *psVar18;
  Move *pMVar19;
  char **unaff_R14;
  PieceType PVar20;
  ulong uVar21;
  Move MVar22;
  string s;
  vector<banksia::Move,_std::allocator<banksia::Move>_> goodMoves;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> moveList;
  Hist hist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> destString;
  MoveFull move;
  uint local_188;
  uint local_174;
  char *local_160;
  ulong local_158;
  char local_150 [20];
  uint local_13c;
  Move *local_138;
  iterator iStack_130;
  Move *local_128;
  ChessBoard *local_120;
  Move *local_118;
  Move *pMStack_110;
  undefined8 local_108;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [40];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *local_68 [2];
  char local_58 [20];
  MoveFull local_44;
  
  local_160 = local_150;
  local_158 = 0;
  local_150[0] = '\0';
  sVar3 = str->_M_string_length;
  local_120 = this;
  if (sVar3 != 0) {
    unaff_R12 = (string *)(str->_M_dataplus)._M_p;
    sVar17 = 0;
    unaff_R14 = &local_160;
    do {
      sVar1 = unaff_R12[sVar17];
      if (((0x2b < (ulong)(byte)sVar1) || ((0xc0800000000U >> ((ulong)(byte)sVar1 & 0x3f) & 1) == 0)
          ) && (sVar1 != (string)0x78)) {
        std::__cxx11::string::push_back((char)unaff_R14);
      }
      sVar17 = sVar17 + 1;
    } while (sVar3 != sVar17);
  }
  iVar11 = std::__cxx11::string::compare((char *)&local_160);
  if ((iVar11 == 0) || (iVar11 = std::__cxx11::string::compare((char *)&local_160), iVar11 == 0)) {
    unaff_R12 = (string *)0x3c;
    if ((local_120->super_BoardCore).side == black) {
      unaff_R12 = (string *)0x4;
    }
    iVar11 = std::__cxx11::string::compare((char *)&local_160);
    unaff_R14 = (char **)(ulong)(((int)unaff_R12 + (uint)(iVar11 == 0) * 4) - 2);
    PVar20 = empty;
    goto LAB_001825d5;
  }
  promotion = empty;
  lVar15 = std::__cxx11::string::find((char *)&local_160,0x18ed4e,0);
  this_00 = local_120;
  puVar9 = pieceTypeName;
  if (lVar15 == -1) {
LAB_0018210c:
    std::__cxx11::string::substr((ulong)local_68,(ulong)&local_160);
    dest = coordinateStringToPos(local_68[0]);
    this_01 = this_00;
    iVar11 = (*(this_00->super_BoardCore).super_Obj._vptr_Obj[6])(this_00,(ulong)dest);
    uVar21 = local_158;
    if ((char)iVar11 == '\0') {
      unaff_R14 = (char **)((ulong)Move::illegalMove._0_8_ >> 0x20);
      psVar18 = (string *)0xffffffff;
      bVar7 = false;
      unaff_R12 = (string *)Move::illegalMove._0_8_;
      PVar20 = Move::illegalMove.promotion;
    }
    else {
      if (local_158 < 3) {
        local_188 = 0xffffffff;
        PVar12 = pawn;
        uVar14 = 0xffffffff;
        psVar18 = (string *)0xffffffff;
      }
      else {
        if ((byte)(*local_160 + 0xbfU) < 0x1a) {
          PVar12 = charToPieceType(this_01,*local_160);
          if (PVar12 != empty) {
            lVar15 = 1;
            goto LAB_001821f7;
          }
          unaff_R14 = (char **)((ulong)Move::illegalMove._0_8_ >> 0x20);
          uVar21 = (ulong)Move::illegalMove.promotion;
          local_188 = 0xffffffff;
          PVar12 = empty;
          uVar14 = 0xffffffff;
          unaff_R12 = (string *)Move::illegalMove._0_8_;
          bVar7 = false;
LAB_001822e7:
          uVar13 = 0xffffffff;
        }
        else {
          PVar12 = pawn;
          lVar15 = 0;
LAB_001821f7:
          uVar14 = 0xffffffff;
          bVar8 = true;
          bVar7 = true;
          uVar21 = (uVar21 - lVar15) - 2;
          if (uVar21 == 0) {
            local_188 = 0xffffffff;
            bVar7 = bVar8;
            goto LAB_001822e7;
          }
          std::__cxx11::string::substr((ulong)local_f8,(ulong)&local_160);
          unaff_R12 = (string *)local_f8;
          std::__cxx11::string::operator=((string *)&local_160,unaff_R12);
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0]);
          }
          if (uVar21 != 2) {
            if (local_158 == 0) {
              std::__throw_out_of_range_fmt
                        ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
            }
            iVar11 = (int)*local_160;
            if (iVar11 - 0x30U < 10) {
              local_188 = 0x38 - iVar11;
              bVar7 = bVar8;
            }
            else {
              uVar14 = iVar11 - 0x61;
              local_188 = 0xffffffff;
              bVar7 = bVar8;
              if (0x19 < (byte)(*local_160 + 0x9fU)) {
                uVar14 = 0xffffffff;
              }
            }
            goto LAB_001822e7;
          }
          uVar13 = coordinateStringToPos(local_160);
          local_188 = 0xffffffff;
        }
        if (!bVar7) {
          bVar7 = false;
          psVar18 = (string *)(ulong)uVar13;
          PVar20 = (PieceType)uVar21;
          goto LAB_001825a8;
        }
        psVar18 = (string *)(ulong)uVar13;
      }
      PVar20 = (PieceType)uVar21;
      local_174 = (uint)psVar18;
      if ((int)local_174 < 0) {
        local_118 = (Move *)0x0;
        pMStack_110 = (Move *)0x0;
        local_108 = 0;
        (*(this_00->super_BoardCore).super_Obj._vptr_Obj[0x11])
                  (this_00,&local_118,(ulong)(this_00->super_BoardCore).side);
        pMVar5 = pMStack_110;
        local_138 = (Move *)0x0;
        iStack_130._M_current = (Move *)0x0;
        local_128 = (Move *)0x0;
        if (local_118 != pMStack_110) {
          local_13c = (local_188 & uVar14) >> 0x1f;
          pMVar19 = local_118;
          do {
            if ((pMVar19->dest == dest) && (pMVar19->promotion == promotion)) {
              pPVar4 = (this_00->super_BoardCore).pieces.
                       super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(this_00->super_BoardCore).pieces.
                                super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) <=
                  (ulong)(long)pMVar19->from) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              if ((PVar12 == pPVar4[pMVar19->from].type) &&
                 ((((char)local_13c != '\0' ||
                   ((-1 < (int)local_188 &&
                    (uVar13 = (*(this_00->super_BoardCore).super_Obj._vptr_Obj[9])(this_00),
                    uVar13 == local_188)))) ||
                  ((-1 < (int)uVar14 &&
                   (uVar13 = (*(this_00->super_BoardCore).super_Obj._vptr_Obj[8])
                                       (this_00,(ulong)(uint)pMVar19->from), uVar13 == uVar14))))))
              {
                if (iStack_130._M_current == local_128) {
                  std::vector<banksia::Move,std::allocator<banksia::Move>>::
                  _M_realloc_insert<banksia::Move_const&>
                            ((vector<banksia::Move,std::allocator<banksia::Move>> *)&local_138,
                             iStack_130,pMVar19);
                }
                else {
                  (iStack_130._M_current)->promotion = pMVar19->promotion;
                  iVar11 = pMVar19->dest;
                  (iStack_130._M_current)->from = pMVar19->from;
                  (iStack_130._M_current)->dest = iVar11;
                  iStack_130._M_current = iStack_130._M_current + 1;
                }
                local_174 = pMVar19->from;
              }
            }
            pMVar19 = (Move *)&pMVar19[1].promotion;
          } while (pMVar19 != pMVar5);
        }
        iVar10._M_current = iStack_130._M_current;
        if (1 < (ulong)(((long)iStack_130._M_current - (long)local_138 >> 2) * -0x5555555555555555)
            && (long)iStack_130._M_current - (long)local_138 != 0) {
          pMVar5 = local_138;
          do {
            pMVar19 = pMVar5 + 1;
            BoardCore::createFullMove
                      (&local_44,&this_00->super_BoardCore,pMVar5->from,dest,promotion);
            local_c0 = local_b0;
            local_b8 = 0;
            local_b0[0] = 0;
            local_a0 = local_90;
            local_98 = 0;
            local_90[0] = 0;
            local_70 = 0;
            local_80 = 0;
            uStack_78 = 0;
            (*(this_00->super_BoardCore).super_Obj._vptr_Obj[0x15])(this_00,&local_44,local_f8);
            iVar11 = (*(this_00->super_BoardCore).super_Obj._vptr_Obj[0x13])
                               (this_00,(ulong)(this_00->super_BoardCore).side);
            (*(this_00->super_BoardCore).super_Obj._vptr_Obj[0x16])(this_00,local_f8);
            if ((byte)iVar11 == 0) {
              local_174 = pMVar5->from;
            }
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
            if (local_c0 != local_b0) {
              operator_delete(local_c0);
            }
            pMVar5 = pMVar19;
          } while (((byte)iVar11 & pMVar19 != iVar10._M_current) != 0);
        }
        if (local_138 != (Move *)0x0) {
          operator_delete(local_138);
        }
        psVar18 = (string *)(ulong)local_174;
        bVar7 = true;
        if (local_118 != (Move *)0x0) {
          operator_delete(local_118);
        }
      }
      else {
        bVar7 = true;
      }
    }
LAB_001825a8:
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  else {
    if (local_158 == lVar15 + 1U) {
      promotion = empty;
    }
    else {
      if (local_158 <= lVar15 + 1U) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
      }
      unaff_R12 = (string *)&local_160;
      bVar2 = local_160[lVar15 + 1];
      bVar6 = bVar2 | 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        bVar6 = bVar2;
      }
      pcVar16 = strchr(pieceTypeName,(int)(char)bVar6);
      promotion = (int)pcVar16 - (int)puVar9;
      if (pcVar16 == (char *)0x0) {
        promotion = empty;
      }
      std::__cxx11::string::substr((ulong)local_f8,(ulong)unaff_R12);
      std::__cxx11::string::operator=((string *)&local_160,(string *)local_f8);
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0]);
      }
      if ((promotion != empty) && (1 < local_158)) goto LAB_0018210c;
    }
    bVar7 = false;
    unaff_R14 = (char **)((ulong)Move::illegalMove._0_8_ >> 0x20);
    dest = 0xffffffff;
    psVar18 = (string *)0xffffffff;
    unaff_R12 = (string *)Move::illegalMove._0_8_;
    PVar20 = Move::illegalMove.promotion;
  }
  if (bVar7) {
    unaff_R14 = (char **)(ulong)dest;
    unaff_R12 = psVar18;
    PVar20 = promotion;
  }
LAB_001825d5:
  if (local_160 != local_150) {
    operator_delete(local_160);
  }
  MVar22._0_8_ = (ulong)unaff_R12 & 0xffffffff | (long)unaff_R14 << 0x20;
  MVar22.promotion = PVar20;
  return MVar22;
}

Assistant:

Move ChessBoard::fromSanString(const std::string& str)
{
    std::string s;
    for(auto ch : str) {
        if (ch != '+' && ch != 'x' && ch != '*' && ch != '#') {
            if (ch < ' ' || ch == '.') ch = ' ';
            s += ch;
        }
    }
    
    int from = -1, dest = -1, fromCol = -1, fromRow = -1;
    auto pieceType = PieceType::pawn, promotion = PieceType::empty;
    
    if (s == "O-O" || s == "O-O-O") {
        from = side == Side::black ? 4 : 60;
        dest = from + (s == "O-O" ? 2 : -2);
    } else {
        auto p = s.find("=");
        if (p != std::string::npos) {
            if (s.length() == p + 1) {
                return Move::illegalMove; // something wrong
            }
            char ch = s.at(p + 1);
            promotion = charToPieceType(ch);
            assert(isValidPromotion(promotion));
            
            s = s.substr(0, p);
            if (s.size() < 2 || promotion == PieceType::empty) {
                return Move::illegalMove;;
            }
        }
        
        auto destString = s.substr(s.length() - 2, 2);
        dest = coordinateStringToPos(destString.c_str());
        
        if (!isPositionValid(dest)) {
            return Move::illegalMove;;
        }
        
        if (s.length() > 2) {
            auto k = 0;
            char ch = s.at(0);
            if (ch >= 'A' && ch <= 'Z') {
                k++;
                pieceType = charToPieceType(ch);
                
                if (pieceType == PieceType::empty) {
                    return Move::illegalMove;;
                }
            }
            
            auto left = s.length() - k - 2;
            if (left > 0) {
                s = s.substr(k, left);
                if (left == 2) {
                    from = coordinateStringToPos(s.c_str());
                } else {
                    char ch = s.at(0);
                    if (isdigit(ch)) {
                        fromRow = 8 - ch + '0';
                    } else if (ch >= 'a' && ch <= 'z') {
                        fromCol = ch - 'a';
                    }
                }
            }
        }
        
        if (from < 0) {
            std::vector<MoveFull> moveList;
            gen(moveList, side);
            
            std::vector<Move> goodMoves;
            for (auto && m : moveList) {
                if (m.dest != dest || m.promotion != promotion ||
                    getPiece(m.from).type != pieceType) {
                    continue;
                }
                
                if ((fromRow < 0 && fromCol < 0) ||
                    (fromRow >= 0 && getRow(m.from) == fromRow) ||
                    (fromCol >= 0 && getColumn(m.from) == fromCol)) {
                    goodMoves.push_back(m);
                    from = m.from;
                }
            }
            
            if (goodMoves.size() > 1) {
                for(auto && m : goodMoves) {
                    MoveFull move = createFullMove(m.from, dest, promotion);
                    Hist hist;
                    make(move, hist);
                    auto incheck = isIncheck(side);
                    takeBack(hist);
                    if (!incheck) {
                        from = m.from;
                        break;
                    }
                }
            }
        }
    }
    
    assert(isValidPromotion(promotion));
    return Move(from, dest, promotion);
}